

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O0

bit_cost_t __thiscall
lzham::lzcompressor::state::get_lit_cost
          (state *this,CLZBase *lzbase,search_accelerator *dict,uint dict_pos,uint lit_pred0,
          uint is_match_model_index)

{
  uint uVar1;
  uint uVar2;
  bit_cost_t bVar3;
  long in_RDI;
  uint in_R9D;
  uint delta_lit;
  uint rep_lit0;
  uint lit;
  bit_cost_t cost;
  uint pos;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 local_30;
  
  bVar3 = adaptive_bit_model::get_cost((adaptive_bit_model *)(in_RDI + 0x24 + (ulong)in_R9D * 2),0);
  pos = (uint)((ulong)in_RDI >> 0x20);
  uVar1 = search_accelerator::operator[]
                    ((search_accelerator *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),pos);
  if (*(uint *)(in_RDI + 4) < 7) {
    local_30 = quasi_adaptive_huffman_data_model::get_cost
                         ((quasi_adaptive_huffman_data_model *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),pos);
  }
  else {
    uVar2 = search_accelerator::operator[]
                      ((search_accelerator *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),pos);
    local_30 = quasi_adaptive_huffman_data_model::get_cost
                         ((quasi_adaptive_huffman_data_model *)
                          CONCAT44(uVar2 ^ uVar1,in_stack_ffffffffffffffc0),pos);
  }
  local_30 = local_30 + bVar3;
  return local_30;
}

Assistant:

bit_cost_t lzcompressor::state::get_lit_cost(CLZBase& lzbase, const search_accelerator& dict, uint dict_pos, uint lit_pred0, uint is_match_model_index) const
   {
		LZHAM_NOTE_UNUSED(lzbase);
		LZHAM_NOTE_UNUSED(lit_pred0);

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(0);

      const uint lit = dict[dict_pos];

      if (m_cur_state < CLZBase::cNumLitStates)
      {
         // literal
         cost += m_lit_table.get_cost(lit);
      }
      else
      {
         // delta literal
         const uint rep_lit0 = dict[(dict_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
         
         uint delta_lit = rep_lit0 ^ lit;

         cost += m_delta_lit_table.get_cost(delta_lit);
      }

      return cost;
   }